

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O1

int slider_newclick(t_gobj *z,_glist *glist,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  t_floatarg in_XMM2_Da;
  t_floatarg in_XMM3_Da;
  t_floatarg in_XMM4_Da;
  
  if (doit != 0) {
    slider_click((t_slider *)z,(float)xpix,(float)ypix,in_XMM2_Da,in_XMM3_Da,in_XMM4_Da);
    *(uint *)&z[0x44].g_pd = (uint)(shift != 0) << 0x19 | *(uint *)&z[0x44].g_pd & 0xfdffffff;
  }
  return 1;
}

Assistant:

static int slider_newclick(t_gobj *z, struct _glist *glist,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_slider* x = (t_slider *)z;

    if(doit)
    {
        slider_click(x, (t_floatarg)xpix, (t_floatarg)ypix, (t_floatarg)shift,
            0, (t_floatarg)alt);
        if(shift)
            x->x_gui.x_fsf.x_finemoved = 1;
        else
            x->x_gui.x_fsf.x_finemoved = 0;
    }
    return (1);
}